

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O1

void __thiscall jsonip::writer<true>::new_member(writer<true> *this,char *str)

{
  undefined8 in_RAX;
  ostream *poVar1;
  size_t sVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  pre(this);
  uStack_28 = CONCAT17(0x22,(undefined7)uStack_28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->os,(char *)((long)&uStack_28 + 7),1);
  if (str == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,str,sVar2);
  }
  uStack_28._0_7_ = CONCAT16(0x22,(undefined6)uStack_28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_28 + 6),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
  this->comma = false;
  return;
}

Assistant:

void new_member(const char* str)
        {
            pre();
            // TODO escape
            os << '"' << str << '"' << " : ";
            comma = false;
        }